

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprocess_p.h
# Opt level: O2

QString * __thiscall
QProcessEnvironmentPrivate::nameToString
          (QString *__return_storage_ptr__,QProcessEnvironmentPrivate *this,Key *name)

{
  QByteArray *this_00;
  long in_FS_OFFSET;
  undefined1 local_38 [16];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QString::fromLocal8Bit<void>(__return_storage_ptr__,name);
  local_38._0_8_ = &this->nameMapMutex;
  local_38._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QBasicMutex::lock((QBasicMutex *)local_38._0_8_);
  local_38[8] = true;
  this_00 = QHash<QString,_QByteArray>::operator[](&this->nameMap,__return_storage_ptr__);
  QByteArray::operator=(this_00,name);
  QMutexLocker<QMutex>::~QMutexLocker((QMutexLocker<QMutex> *)local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

inline QString nameToString(const Key &name) const
    {
        const QString sname = QString::fromLocal8Bit(name);
        {
            const NameMapMutexLocker locker(this);
            nameMap[sname] = name;
        }
        return sname;
    }